

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode baller_connect(Curl_cfilter *cf,Curl_easy *data,eyeballer *baller,curltime *now,
                       _Bool *connected)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  CURLcode CVar5;
  timediff_t tVar6;
  curltime newer;
  curltime older;
  _Bool *connected_local;
  curltime *now_local;
  eyeballer *baller_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  *connected = ((byte)baller->field_0x64 >> 3 & 1) != 0;
  if ((baller->result == CURLE_OK) && ((*connected & 1U) == 0)) {
    CVar5 = Curl_conn_cf_connect(baller->cf,data,false,connected);
    baller->result = CVar5;
    if (baller->result == CURLE_OK) {
      if ((*connected & 1U) == 0) {
        uVar1 = now->tv_sec;
        uVar2 = now->tv_usec;
        newer.tv_usec = uVar2;
        newer.tv_sec = uVar1;
        uVar3 = (baller->started).tv_sec;
        uVar4 = (baller->started).tv_usec;
        older.tv_usec = uVar4;
        older.tv_sec = uVar3;
        newer._12_4_ = 0;
        older._12_4_ = 0;
        tVar6 = Curl_timediff(newer,older);
        if (baller->timeoutms <= tVar6) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"%s connect timeout after %ldms, move on!",baller->name,
                       baller->timeoutms);
          }
          baller->error = 0x6e;
          baller->result = CURLE_OPERATION_TIMEDOUT;
        }
      }
      else {
        baller->field_0x64 = baller->field_0x64 & 0xf7 | 8;
        baller->field_0x64 = baller->field_0x64 & 0xfb | 4;
      }
    }
    else if (baller->result == CURLE_WEIRD_SERVER_REPLY) {
      baller->field_0x64 = baller->field_0x64 & 0xdf | 0x20;
    }
  }
  return baller->result;
}

Assistant:

static CURLcode baller_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               struct eyeballer *baller,
                               struct curltime *now,
                               bool *connected)
{
  (void)cf;
  *connected = baller->connected;
  if(!baller->result &&  !*connected) {
    /* evaluate again */
    baller->result = Curl_conn_cf_connect(baller->cf, data, 0, connected);

    if(!baller->result) {
      if(*connected) {
        baller->connected = TRUE;
        baller->is_done = TRUE;
      }
      else if(Curl_timediff(*now, baller->started) >= baller->timeoutms) {
        infof(data, "%s connect timeout after %" FMT_TIMEDIFF_T
              "ms, move on!", baller->name, baller->timeoutms);
#if defined(ETIMEDOUT)
        baller->error = ETIMEDOUT;
#endif
        baller->result = CURLE_OPERATION_TIMEDOUT;
      }
    }
    else if(baller->result == CURLE_WEIRD_SERVER_REPLY)
      baller->inconclusive = TRUE;
  }
  return baller->result;
}